

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O1

SAT * CompoundFile::loadSSAT(SAT *__return_storage_ptr__,Header *header,istream *stream,SAT *sat)

{
  Header *pHVar1;
  pointer pSVar2;
  int32_t secID;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  char c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> ssat;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> chain;
  SecID local_8c;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_88;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_68;
  SAT *local_50;
  Header *local_48;
  pointer local_40;
  pointer local_38;
  
  local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_finish = (SecID *)0x0;
  local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (SecID *)0x0;
  uVar3 = (header->m_ssatFirstSecID).m_id;
  if (uVar3 != 0xfffffffe) {
    local_8c.m_id = uVar3;
    local_50 = __return_storage_ptr__;
    SAT::sectors(&local_68,sat,&local_8c);
    local_40 = local_68.
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pSVar2 = local_68.
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_start;
      local_48 = header;
      do {
        pHVar1 = local_48;
        local_38 = pSVar2;
        std::istream::seekg(stream,(long)pSVar2->m_id * (long)local_48->m_sectorSize + 0x200,0);
        iVar5 = pHVar1->m_sectorSize;
        iVar6 = iVar5 + 3;
        if (-1 < iVar5) {
          iVar6 = iVar5;
        }
        if (3 < iVar5) {
          iVar5 = 0;
          do {
            lVar4 = 0;
            uVar3 = 0;
            do {
              local_8c.m_id = local_8c.m_id & 0xffffff00;
              std::istream::get((char *)stream);
              uVar3 = uVar3 | (local_8c.m_id & 0xffU) << ((byte)lVar4 & 0x1f);
              lVar4 = lVar4 + 8;
            } while (lVar4 != 0x20);
            local_8c.m_id = uVar3;
            if (local_88.
                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_88.
                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::
              _M_realloc_insert<CompoundFile::SecID>
                        (&local_88,
                         (iterator)
                         local_88.
                         super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_8c);
            }
            else {
              (local_88.
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_finish)->m_id = uVar3;
              local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_88.
                   super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
            iVar5 = iVar5 + 1;
          } while (iVar5 != iVar6 >> 2);
        }
        pSVar2 = local_38 + 1;
      } while (pSVar2 != local_40);
    }
    __return_storage_ptr__ = local_50;
    if (local_68.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      __return_storage_ptr__ = local_50;
    }
  }
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            (&__return_storage_ptr__->m_sat,&local_88);
  if (local_88.super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.
                          super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline SAT
loadSSAT( const Header & header, std::istream & stream,
	const SAT & sat )
{
	std::vector< SecID > ssat;

	if( header.ssatFirstSecID() != SecID::EndOfChain )
	{
		std::vector< SecID > chain = sat.sectors( header.ssatFirstSecID() );

		for( std::vector< SecID >::const_iterator it = chain.begin(),
			last = chain.end(); it != last; ++it )
		{
			stream.seekg( calcFileOffset( *it, header.sectorSize() ) );

			loadSATSector( stream, ssat, header.sectorSize() );
		}
	}

	return SAT( ssat );
}